

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

int lys_features_change(lys_module *module,char *name,int op)

{
  byte *pbVar1;
  lys_feature *plVar2;
  byte bVar3;
  lys_feature *plVar4;
  int iVar5;
  int iVar6;
  LY_ERR *pLVar7;
  lys_module *plVar8;
  char *pcVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  int local_48;
  int local_40;
  uint local_3c;
  int local_38;
  
  uVar10 = 1;
  if ((name != (char *)0x0 && module != (lys_module *)0x0) && (*name != '\0')) {
    iVar5 = strcmp(name,"*");
    uVar12 = 0xffffffffffffffff;
    local_38 = 0;
    uVar10 = 0;
    do {
      do {
        plVar8 = module;
        if (uVar12 != 0xffffffffffffffff) {
          plVar8 = (lys_module *)module->inc[uVar12].submodule;
        }
        bVar3 = plVar8->features_size;
        local_3c = uVar10;
        if ((ulong)bVar3 != 0) {
          plVar4 = plVar8->features;
          uVar13 = 0;
          do {
            if ((iVar5 == 0) || (iVar6 = strcmp(plVar4[uVar13].name,name), iVar6 == 0)) {
              if (op == 0) {
                if ((plVar4[uVar13].flags >> 8 & 1) != 0) {
                  lys_features_disable_recursive(plVar4 + uVar13);
                  local_38 = local_38 + 1;
                }
              }
              else if ((plVar4[uVar13].flags >> 8 & 1) == 0) {
                plVar2 = plVar4 + uVar13;
                if (plVar4[uVar13].iffeature_size == '\0') {
                  uVar10 = 0;
                }
                else {
                  lVar14 = 0;
                  uVar11 = 0;
                  do {
                    iVar6 = resolve_iffeature((lys_iffeature *)
                                              ((long)&plVar2->iffeature->expr + lVar14));
                    if (iVar6 == 0) {
                      if (iVar5 != 0) {
                        pLVar7 = ly_errno_location();
                        *pLVar7 = LY_EINVAL;
                        pcVar9 = plVar2->name;
                        local_3c = (int)uVar11 + 1;
                        goto LAB_0015a3a4;
                      }
                      local_3c = (int)uVar11 + 1;
                      local_48 = (int)uVar12;
                      local_40 = (int)uVar13;
                      break;
                    }
                    uVar11 = uVar11 + 1;
                    lVar14 = lVar14 + 0x20;
                  } while (uVar11 < plVar2->iffeature_size);
                  uVar10 = (uint)uVar11;
                }
                if (uVar10 == plVar2->iffeature_size) {
                  pbVar1 = (byte *)((long)&plVar2->flags + 1);
                  *pbVar1 = *pbVar1 | 1;
                  local_38 = local_38 + 1;
                }
              }
              if (iVar5 != 0) {
                return 0;
              }
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != bVar3);
        }
        uVar12 = uVar12 + 1;
        uVar10 = local_3c;
      } while (uVar12 < module->inc_size);
      if (local_38 == 0) break;
      uVar12 = 0xffffffffffffffff;
      uVar10 = 0;
      local_38 = 0;
    } while (local_3c != 0);
    if (local_3c == 0) {
      uVar10 = (uint)(iVar5 != 0);
    }
    else {
      pLVar7 = ly_errno_location();
      *pLVar7 = LY_EINVAL;
      if (local_48 != -1) {
        module = (lys_module *)module->inc[local_48].submodule;
      }
      pcVar9 = module->features[local_40].name;
LAB_0015a3a4:
      ly_log(LY_LLERR,"Feature \"%s\" is disabled by its %d. if-feature condition.",pcVar9,
             (ulong)local_3c);
      uVar10 = 1;
    }
  }
  return uVar10;
}

Assistant:

static int
lys_features_change(const struct lys_module *module, const char *name, int op)
{
    int all = 0;
    int i, j, k;
    int progress, faili, failj, failk;

    uint8_t fsize;
    struct lys_feature *f;

    if (!module || !name || !strlen(name)) {
        return EXIT_FAILURE;
    }

    if (!strcmp(name, "*")) {
        /* enable all */
        all = 1;
    }

    progress = failk = 1;
    while (progress && failk) {
        for (i = -1, failk = progress = 0; i < module->inc_size; i++) {
            if (i == -1) {
                fsize = module->features_size;
                f = module->features;
            } else {
                fsize = module->inc[i].submodule->features_size;
                f = module->inc[i].submodule->features;
            }

            for (j = 0; j < fsize; j++) {
                if (all || !strcmp(f[j].name, name)) {
                    if ((op && (f[j].flags & LYS_FENABLED)) || (!op && !(f[j].flags & LYS_FENABLED))) {
                        if (all) {
                            /* skip already set features */
                            continue;
                        } else {
                            /* feature already set correctly */
                            return EXIT_SUCCESS;
                        }
                    }

                    if (op) {
                        /* check referenced features if they are enabled */
                        for (k = 0; k < f[j].iffeature_size; k++) {
                            if (!resolve_iffeature(&f[j].iffeature[k])) {
                                if (all) {
                                    faili = i;
                                    failj = j;
                                    failk = k + 1;
                                    break;
                                } else {
                                    LOGERR(LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
                                           f[j].name, k + 1);
                                    return EXIT_FAILURE;
                                }
                            }
                        }

                        if (k == f[j].iffeature_size) {
                            /* the last check passed, do the change */
                            f[j].flags |= LYS_FENABLED;
                            progress++;
                        }
                    } else {
                        lys_features_disable_recursive(&f[j]);
                        progress++;
                    }
                    if (!all) {
                        /* stop in case changing a single feature */
                        return EXIT_SUCCESS;
                    }
                }
            }
        }
    }
    if (failk) {
        /* print info about the last failing feature */
        LOGERR(LY_EINVAL, "Feature \"%s\" is disabled by its %d. if-feature condition.",
               faili == -1 ? module->features[failj].name : module->inc[faili].submodule->features[failj].name, failk);
        return EXIT_FAILURE;
    }

    if (all) {
        return EXIT_SUCCESS;
    } else {
        /* the specified feature not found */
        return EXIT_FAILURE;
    }
}